

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O1

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
::remove_interaction
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_u,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_v)

{
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  _Alloc_hider _Var3;
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  *this_00;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  bool bVar9;
  __node_base *p_Var10;
  __node_base *p_Var11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
  *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  iVar5 = std::__cxx11::string::compare((string *)arg_v);
  pbVar6 = arg_u;
  if (iVar5 < 0) {
    pbVar6 = arg_v;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar1 = (pbVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + pbVar6->_M_string_length);
  iVar5 = std::__cxx11::string::compare((string *)arg_u);
  if (iVar5 < 0) {
    arg_u = arg_v;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar1 = (arg_u->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + arg_u->_M_string_length);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_70,&local_98,&local_b8);
  cVar7 = std::
          _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_quadratic)._M_h,&local_70);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->m_quadratic)._M_h,&local_70);
  }
  _Var3._M_p = local_98._M_dataplus._M_p;
  p_Var11 = &(this->m_quadratic)._M_h._M_before_begin;
  bVar9 = true;
  p_Var10 = p_Var11;
  local_78 = this;
  do {
    p_Var10 = p_Var10->_M_nxt;
    if (p_Var10 == (__node_base *)0x0) break;
    p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor;
    if (p_Var2 == (_Hash_node_base *)local_98._M_string_length) {
      if (p_Var2 != (_Hash_node_base *)0x0) {
        iVar5 = bcmp(p_Var10[1]._M_nxt,_Var3._M_p,(size_t)p_Var2);
        if (iVar5 != 0) goto LAB_0017931f;
      }
      bVar4 = false;
      bVar9 = false;
    }
    else {
LAB_0017931f:
      p_Var2 = p_Var10[6]._M_nxt;
      if (p_Var2 == (_Hash_node_base *)local_98._M_string_length) {
        if (p_Var2 == (_Hash_node_base *)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(p_Var10[5]._M_nxt,_Var3._M_p,(size_t)p_Var2);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      bVar4 = (bool)(bVar12 ^ 1);
      if (bVar12) {
        bVar9 = false;
      }
    }
  } while (bVar4);
  this_00 = local_78;
  if (bVar9) {
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)local_78,&local_98);
    if ((*pmVar8 == 0.0) && (!NAN(*pmVar8))) {
      remove_variable(this_00,&local_98);
    }
  }
  _Var3._M_p = local_b8._M_dataplus._M_p;
  bVar9 = true;
  do {
    p_Var11 = p_Var11->_M_nxt;
    if (p_Var11 == (__node_base *)0x0) break;
    p_Var2 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor;
    if (p_Var2 == (_Hash_node_base *)local_b8._M_string_length) {
      if (p_Var2 != (_Hash_node_base *)0x0) {
        iVar5 = bcmp(p_Var11[1]._M_nxt,_Var3._M_p,(size_t)p_Var2);
        if (iVar5 != 0) goto LAB_001793c5;
      }
      bVar4 = false;
      bVar9 = false;
    }
    else {
LAB_001793c5:
      p_Var2 = p_Var11[6]._M_nxt;
      if (p_Var2 == (_Hash_node_base *)local_b8._M_string_length) {
        if (p_Var2 == (_Hash_node_base *)0x0) {
          bVar12 = true;
        }
        else {
          iVar5 = bcmp(p_Var11[5]._M_nxt,_Var3._M_p,(size_t)p_Var2);
          bVar12 = iVar5 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      bVar4 = (bool)(bVar12 ^ 1);
      if (bVar12) {
        bVar9 = false;
      }
    }
  } while (bVar4);
  if (bVar9) {
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&local_b8);
    if ((*pmVar8 == 0.0) && (!NAN(*pmVar8))) {
      remove_variable(this_00,&local_b8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void remove_interaction( const IndexType &arg_u, const IndexType &arg_v ) {
      IndexType u = std::min( arg_u, arg_v );
      IndexType v = std::max( arg_u, arg_v );
      auto p = std::make_pair( u, v );
      if ( m_quadratic.count( p ) != 0 ) {
        m_quadratic.erase( p );
      }

      bool u_flag = true;
      for ( auto &it : m_quadratic ) {
        if ( ( it.first.first == u ) || ( it.first.second == u ) ) {
          u_flag = false;
          break;
        }
      }

      if ( u_flag && ( m_linear[ u ] == 0 ) ) {
        remove_variable( u );
      }

      bool v_flag = true;
      for ( auto &it : m_quadratic ) {
        if ( ( it.first.first == v ) || ( it.first.second == v ) ) {
          v_flag = false;
          break;
        }
      }

      if ( v_flag && ( m_linear[ v ] == 0 ) ) {
        remove_variable( v );
      }
    }